

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O2

oonf_rfc5444_target * oonf_rfc5444_add_target(oonf_rfc5444_interface *interf,netaddr *dst)

{
  long lVar1;
  undefined8 uVar2;
  ulong uVar3;
  oonf_rfc5444_target *poVar4;
  netaddr_str nbuf;
  
  lVar1 = avl_find(&interf->_target_tree);
  if (lVar1 == 0) {
    poVar4 = _create_target(interf,dst,true);
    if (poVar4 == (oonf_rfc5444_target *)0x0) {
      return (oonf_rfc5444_target *)0x0;
    }
    (poVar4->_node).key = &poVar4->dst;
    avl_insert(&interf->_target_tree,&poVar4->_node);
  }
  else {
    poVar4 = (oonf_rfc5444_target *)(lVar1 + -0xa0);
  }
  uVar3 = (ulong)_oonf_rfc5444_subsystem.logging;
  if (((&log_global_mask)[uVar3] & 2) != 0) {
    uVar2 = netaddr_to_prefixstring(&nbuf,dst,0);
    oonf_log(2,uVar3,"src/base/oonf_rfc5444.c",0x341,0,0,
             "Add target %s to interface %s on protocol %s (refcount was %d)",uVar2,interf,
             interf->protocol,poVar4->_refcount);
  }
  interf->_refcount = interf->_refcount + 1;
  return poVar4;
}

Assistant:

struct oonf_rfc5444_target *
oonf_rfc5444_add_target(struct oonf_rfc5444_interface *interf, struct netaddr *dst) {
  struct oonf_rfc5444_target *target;
#ifdef OONF_LOG_INFO
  struct netaddr_str nbuf;
#endif

  target = avl_find_element(&interf->_target_tree, dst, target, _node);
  if (!target) {
    target = _create_target(interf, dst, true);
    if (target == NULL) {
      return NULL;
    }

    /* hook into interface tree */
    target->_node.key = &target->dst;
    avl_insert(&interf->_target_tree, &target->_node);
  }

  OONF_INFO(LOG_RFC5444, "Add target %s to interface %s on protocol %s (refcount was %d)",
    netaddr_to_string(&nbuf, dst), interf->name, interf->protocol->name, target->_refcount);

  /* increase interface refcount */
  interf->_refcount++;
  return target;
}